

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_table.cpp
# Opt level: O1

void __thiscall
InlineTable_EmptyWithSpaces_Test::~InlineTable_EmptyWithSpaces_Test
          (InlineTable_EmptyWithSpaces_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(InlineTable, EmptyWithSpaces) {
    std::istringstream input("key = {  \t  \t\t  } ");
    events_aggregator_t handler;

    loltoml::parse(input, handler);

    std::vector<sax_event_t> expected_events = {
        {sax_event_t::start_document},
        {sax_event_t::key, "key"},
        {sax_event_t::start_inline_table},
        {sax_event_t::finish_inline_table, 0},
        {sax_event_t::finish_document}
    };

    EXPECT_EQ(expected_events, handler.events);
}